

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall Saturation::SaturationAlgorithm::newClausesToUnprocessed(SaturationAlgorithm *this)

{
  Clause **ppCVar1;
  Clause *cl;
  uint uVar2;
  
  if (*(char *)(Lib::env + 0x16b2) == '\x01') {
    ppCVar1 = (this->_newClauses)._s._stack;
    Shell::Shuffling::shuffleArray<Kernel::Clause*>
              (ppCVar1,(uint)((ulong)((long)(this->_newClauses)._s._cursor - (long)ppCVar1) >> 3));
  }
  while (ppCVar1 = (this->_newClauses)._s._cursor, ppCVar1 != (this->_newClauses)._s._stack) {
    (this->_newClauses)._s._cursor = ppCVar1 + -1;
    cl = ppCVar1[-1];
    uVar2 = *(uint *)&cl->field_0x38 >> 0x19 & 7;
    if (uVar2 == 3) {
      addUnprocessedClause(this,cl);
    }
    else if (uVar2 == 0) {
      onNonRedundantClause(this,cl);
    }
    Kernel::Clause::decRefCnt(cl);
  }
  return;
}

Assistant:

void SaturationAlgorithm::newClausesToUnprocessed()
{
  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Shuffling::shuffleArray(_newClauses.naked().begin(), _newClauses.size());
  }

  while (_newClauses.isNonEmpty()) {
    Clause* cl = _newClauses.popWithoutDec();
    switch (cl->store()) {
      case Clause::UNPROCESSED:
        break;
      case Clause::PASSIVE:
        onNonRedundantClause(cl);
        break;
      case Clause::NONE:
        addUnprocessedClause(cl);
        break;
      case Clause::SELECTED:
      case Clause::ACTIVE:
#if VDEBUG
        cout << "FAIL: " << cl->toString() << endl;
        // such clauses should not appear as new ones
        cout << cl->toString() << endl;
#endif
        ASSERTION_VIOLATION_REP(cl->store());
    }
    cl->decRefCnt(); // belongs to _newClauses.popWithoutDec()
  }
}